

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  bool bVar1;
  CppType CVar2;
  uint uVar3;
  Type TVar4;
  FastFieldValuePrinter *pFVar5;
  Message *message_00;
  uint64 uVar6;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar8;
  string scratch;
  string truncated_value;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar5 = GetFieldPrinter(this,field);
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
    if (*(int *)(field + 0x3c) == 3) {
      uVar3 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar3 = Reflection::GetInt32(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[3];
    break;
  case CPPTYPE_INT64:
    if (*(int *)(field + 0x3c) == 3) {
      uVar6 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      uVar6 = Reflection::GetInt64(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[5];
    goto LAB_0027ead0;
  case CPPTYPE_UINT32:
    if (*(int *)(field + 0x3c) == 3) {
      uVar3 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar3 = Reflection::GetUInt32(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[4];
    break;
  case CPPTYPE_UINT64:
    if (*(int *)(field + 0x3c) == 3) {
      uVar6 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar6 = Reflection::GetUInt64(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[6];
LAB_0027ead0:
    (*UNRECOVERED_JUMPTABLE)(pFVar5,uVar6,generator,UNRECOVERED_JUMPTABLE);
    return;
  case CPPTYPE_DOUBLE:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::GetRepeatedDouble(reflection,message,field,index);
    }
    else {
      Reflection::GetDouble(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[8];
    goto LAB_0027eb02;
  case CPPTYPE_FLOAT:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[7];
LAB_0027eb02:
    (*UNRECOVERED_JUMPTABLE)(pFVar5,generator);
    return;
  case CPPTYPE_BOOL:
    if (*(int *)(field + 0x3c) == 3) {
      bVar1 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar1 = Reflection::GetBool(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[2];
    uVar8 = (ulong)bVar1;
    goto LAB_0027eb37;
  case CPPTYPE_ENUM:
    if (*(int *)(field + 0x3c) == 3) {
      uVar3 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar3 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar7 = EnumDescriptor::FindValueByNumber(this_01,uVar3);
    if (pEVar7 != (EnumValueDescriptor *)0x0) {
      (*pFVar5->_vptr_FastFieldValuePrinter[0xb])
                (pFVar5,(ulong)uVar3,*(undefined8 *)pEVar7,generator);
      return;
    }
    StringPrintf_abi_cxx11_(&local_b0,"%d",(ulong)uVar3);
    (*pFVar5->_vptr_FastFieldValuePrinter[0xb])(pFVar5,(ulong)uVar3,&local_b0,generator);
    goto LAB_0027ec28;
  case CPPTYPE_STRING:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    if (*(int *)(field + 0x3c) == 3) {
      this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_b0);
    }
    else {
      this_00 = Reflection::GetStringReference(reflection,message,field,&local_b0);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)this_00);
      std::operator+(&local_50,&local_90,"...<truncated>...");
      this_00 = &local_70;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
    }
    TVar4 = FieldDescriptor::type(field);
    (*pFVar5->_vptr_FastFieldValuePrinter[(ulong)(TVar4 != TYPE_STRING) + 9])
              (pFVar5,this_00,generator);
    std::__cxx11::string::~string((string *)&local_70);
LAB_0027ec28:
    std::__cxx11::string::~string((string *)&local_b0);
switchD_0027e878_default:
    return;
  case CPPTYPE_MESSAGE:
    if (*(int *)(field + 0x3c) == 3) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
    return;
  default:
    goto switchD_0027e878_default;
  }
  uVar8 = (ulong)uVar3;
LAB_0027eb37:
  (*UNRECOVERED_JUMPTABLE)(pFVar5,uVar8,generator,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StringPrintf("%d", enum_value),
                           generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}